

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_import(lysp_yin_ctx *ctx,import_meta *imp_meta)

{
  LY_ERR LVar1;
  lysp_import *__s;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement subelems [5];
  char *p__;
  lysp_import *imp;
  import_meta *imp_meta_local;
  lysp_yin_ctx *ctx_local;
  
  if (*imp_meta->imports == (lysp_import *)0x0) {
    subelems[4]._16_8_ = malloc(0x48);
    if ((undefined8 *)subelems[4]._16_8_ == (undefined8 *)0x0) {
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_import"
            );
      return LY_EMEM;
    }
    *(undefined8 *)subelems[4]._16_8_ = 1;
  }
  else {
    *(long *)((*imp_meta->imports)[-1].rev + 6) = *(long *)((*imp_meta->imports)[-1].rev + 6) + 1;
    subelems[4]._16_8_ =
         realloc((*imp_meta->imports)[-1].rev + 6,
                 *(long *)((*imp_meta->imports)[-1].rev + 6) * 0x40 + 8);
    if ((void *)subelems[4]._16_8_ == (void *)0x0) {
      *(long *)((*imp_meta->imports)[-1].rev + 6) = *(long *)((*imp_meta->imports)[-1].rev + 6) + -1
      ;
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_import"
            );
      return LY_EMEM;
    }
  }
  subelems[4]._16_8_ = subelems[4]._16_8_ + 8;
  *imp_meta->imports = (lysp_import *)subelems[4]._16_8_;
  __s = *imp_meta->imports + *(long *)((*imp_meta->imports)[-1].rev + 6) + -1;
  memset(__s,0,0x40);
  ret___1 = 0x80000;
  subelems[0]._0_8_ = &__s->dsc;
  subelems[0].dest._0_2_ = 2;
  subelems[0].flags = 0;
  subelems[0]._18_2_ = 0x24;
  subelems[1]._0_8_ = &__s->prefix;
  subelems[1].dest._0_2_ = 3;
  subelems[1].flags = 0;
  subelems[1]._18_2_ = 0x27;
  subelems[2]._0_8_ = &__s->ref;
  subelems[2].dest._0_2_ = 2;
  subelems[2].flags = 0;
  subelems[2]._18_2_ = 0x2b;
  subelems[3]._0_8_ = __s->rev;
  subelems[3].dest._0_2_ = 2;
  memset(&subelems[3].flags,0,0x18);
  subelems[3].flags = 0;
  subelems[3]._18_2_ = 0xf;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((((ctx_local._4_4_ == LY_SUCCESS) &&
       (ctx_local._4_4_ =
             yin_parse_attribute(ctx,YIN_ARG_MODULE,&__s->name,Y_IDENTIF_ARG,LY_STMT_IMPORT),
       ctx_local._4_4_ == LY_SUCCESS)) &&
      (ctx_local._4_4_ =
            yin_parse_content(ctx,(yin_subelement *)&ret___1,5,__s,LY_STMT_IMPORT,(char **)0x0,
                              &__s->exts), ctx_local._4_4_ == LY_SUCCESS)) &&
     (ctx_local._4_4_ = yin_unres_exts_add(ctx,__s->exts), ctx_local._4_4_ == LY_SUCCESS)) {
    LVar1 = lysp_check_prefix((lysp_ctx *)ctx,*imp_meta->imports,imp_meta->prefix,&__s->prefix);
    if (LVar1 == LY_SUCCESS) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      ctx_local._4_4_ = LY_EVALID;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_import(struct lysp_yin_ctx *ctx, struct import_meta *imp_meta)
{
    struct lysp_import *imp;

    /* allocate new element in sized array for import */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *imp_meta->imports, imp, LY_EMEM);

    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &imp->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_PREFIX, &imp->prefix, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &imp->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REVISION_DATE, imp->rev, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    /* parse import attributes */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_MODULE, &imp->name, Y_IDENTIF_ARG, LY_STMT_IMPORT));
    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), imp, LY_STMT_IMPORT, NULL, &imp->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, imp->exts));

    /* check prefix validity */
    LY_CHECK_RET(lysp_check_prefix((struct lysp_ctx *)ctx, *imp_meta->imports, imp_meta->prefix, &imp->prefix), LY_EVALID);

    return LY_SUCCESS;
}